

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O1

void __thiscall winmd::reader::RetTypeSig::~RetTypeSig(RetTypeSig *this)

{
  pointer pCVar1;
  
  if ((this->m_type).super__Optional_base<winmd::reader::TypeSig,_false,_false>._M_payload.
      super__Optional_payload<winmd::reader::TypeSig,_true,_false,_false>.
      super__Optional_payload_base<winmd::reader::TypeSig>._M_engaged == true) {
    std::_Optional_payload_base<winmd::reader::TypeSig>::_M_destroy
              ((_Optional_payload_base<winmd::reader::TypeSig> *)&this->m_type);
  }
  pCVar1 = (this->m_cmod).
           super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1,(long)(this->m_cmod).
                                 super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar1);
    return;
  }
  return;
}

Assistant:

RetTypeSig(table_base const* table, byte_view& data)
            : m_cmod(parse_cmods(table, data))
            , m_byref(is_by_ref(data))
        {
            auto cursor = data;
            auto element_type = uncompress_enum<ElementType>(cursor);
            if (element_type == ElementType::Void)
            {
                data = cursor;
            }
            else
            {
                m_type.emplace(table, data);
            }
        }